

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeaveScriptObject.cpp
# Opt level: O2

void __thiscall Js::EnterScriptObject::~EnterScriptObject(EnterScriptObject *this)

{
  ScriptContext::OnScriptEnd(this->scriptContext,this->isCallRoot,this->hasForcedEnter);
  if (-1 < this->hr) {
    ThreadContext::PopHostScriptContext(this->scriptContext->threadContext);
  }
  ThreadContext::EnterScriptEnd
            (this->scriptContext->threadContext,this->entryExitRecord,this->doCleanup);
  ScriptContext::ProfileEnd(this->scriptContext,RunPhase);
  return;
}

Assistant:

EnterScriptObject::~EnterScriptObject()
    {
        scriptContext->OnScriptEnd(isCallRoot, hasForcedEnter);
        if (SUCCEEDED(hr))
        {
            scriptContext->GetThreadContext()->PopHostScriptContext();
        }
        scriptContext->GetThreadContext()->EnterScriptEnd(entryExitRecord, doCleanup);
#ifdef PROFILE_EXEC
        scriptContext->ProfileEnd(Js::RunPhase);
#endif
    }